

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

bool __thiscall AddrInfo::IsTerrible(AddrInfo *this,NodeSeconds now)

{
  long lVar1;
  strong_ordering sVar2;
  bool bVar3;
  bool bVar4;
  rep rVar5;
  duration<long,_std::ratio<1L,_1L>_> *in_RDI;
  long in_FS_OFFSET;
  __unspec *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  duration<long,_std::ratio<60L,_1L>_> *in_stack_ffffffffffffff78;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> t;
  bool local_62;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::chrono::operator-
            ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
             (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_ffffffffffffff68);
  min<(char)49>();
  sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<60L,_1L>_>
                    (in_RDI,in_stack_ffffffffffffff78);
  std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffff68,(__unspec *)0x87d93a);
  bVar3 = std::operator<=(sVar2._M_value);
  if (bVar3) {
    local_62 = false;
  }
  else {
    t.__d.__r = (duration)(in_RDI + 5);
    min<(char)49,(char)48>();
    std::chrono::operator+
              ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
               CONCAT17(in_stack_ffffffffffffff77,
                        CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
               (duration<long,_std::ratio<60L,_1L>_> *)in_stack_ffffffffffffff68);
    sVar2 = std::chrono::
            operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                      ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       CONCAT17(in_stack_ffffffffffffff77,
                                CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                       (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       in_stack_ffffffffffffff68);
    std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffff68,(__unspec *)0x87d9a4);
    bVar3 = std::operator>(sVar2._M_value);
    if (bVar3) {
      local_62 = true;
    }
    else {
      std::chrono::operator-
                ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff77,
                          CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                 (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                 in_stack_ffffffffffffff68);
      sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<3600L,_1L>_>
                        (in_RDI,(duration<long,_std::ratio<3600L,_1L>_> *)t.__d.__r);
      std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffff68,(__unspec *)0x87d9fc);
      bVar3 = std::operator>(sVar2._M_value);
      if (bVar3) {
        local_62 = true;
      }
      else {
        rVar5 = TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                          (t);
        if ((rVar5 == 0) && (2 < (int)in_RDI[0xe].__r)) {
          local_62 = true;
        }
        else {
          std::chrono::operator-
                    ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     CONCAT17(in_stack_ffffffffffffff77,
                              CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_ffffffffffffff68);
          sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<3600L,_1L>_>
                            (in_RDI,(duration<long,_std::ratio<3600L,_1L>_> *)t.__d.__r);
          std::__cmp_cat::__unspec::__unspec(in_stack_ffffffffffffff68,(__unspec *)0x87da84);
          bVar4 = std::operator>(sVar2._M_value);
          bVar3 = false;
          if (bVar4) {
            bVar3 = 9 < (int)in_RDI[0xe].__r;
          }
          if (bVar3) {
            local_62 = true;
          }
          else {
            local_62 = false;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_62;
}

Assistant:

bool AddrInfo::IsTerrible(NodeSeconds now) const
{
    if (now - m_last_try <= 1min) { // never remove things tried in the last minute
        return false;
    }

    if (nTime > now + 10min) { // came in a flying DeLorean
        return true;
    }

    if (now - nTime > ADDRMAN_HORIZON) { // not seen in recent history
        return true;
    }

    if (TicksSinceEpoch<std::chrono::seconds>(m_last_success) == 0 && nAttempts >= ADDRMAN_RETRIES) { // tried N times and never a success
        return true;
    }

    if (now - m_last_success > ADDRMAN_MIN_FAIL && nAttempts >= ADDRMAN_MAX_FAILURES) { // N successive failures in the last week
        return true;
    }

    return false;
}